

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::FindRequiresForMessage
          (Generator *this,GeneratorOptions *options,Descriptor *desc,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *required,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *forwards,bool *have_message)

{
  bool bVar1;
  FieldDescriptor *pFVar2;
  FieldDescriptor *pFVar3;
  long lVar4;
  long lVar5;
  
  *have_message = true;
  if (0 < *(int *)(desc + 0x68)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      pFVar2 = (FieldDescriptor *)(*(long *)(desc + 0x28) + lVar4);
      pFVar3 = pFVar2;
      bVar1 = anon_unknown_0::IgnoreField(pFVar2);
      if (!bVar1) {
        FindRequiresForField((Generator *)pFVar3,options,pFVar2,required,forwards);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x98;
    } while (lVar5 < *(int *)(desc + 0x68));
  }
  if (0 < *(int *)(desc + 0x80)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      pFVar2 = (FieldDescriptor *)(*(long *)(desc + 0x50) + lVar4);
      pFVar3 = pFVar2;
      bVar1 = anon_unknown_0::IgnoreField(pFVar2);
      if (!bVar1) {
        FindRequiresForExtension((Generator *)pFVar3,options,pFVar2,required,forwards);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x98;
    } while (lVar5 < *(int *)(desc + 0x80));
  }
  if (0 < *(int *)(desc + 0x74)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      FindRequiresForMessage
                (this,options,(Descriptor *)(*(long *)(desc + 0x38) + lVar4),required,forwards,
                 have_message);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x90;
    } while (lVar5 < *(int *)(desc + 0x74));
  }
  return;
}

Assistant:

void Generator::FindRequiresForMessage(const GeneratorOptions& options,
                                       const Descriptor* desc,
                                       std::set<std::string>* required,
                                       std::set<std::string>* forwards,
                                       bool* have_message) const {

  if (!NamespaceOnly(desc)) {
    *have_message = true;
    for (int i = 0; i < desc->field_count(); i++) {
      const FieldDescriptor* field = desc->field(i);
      if (IgnoreField(field)) {
        continue;
      }
      FindRequiresForField(options, field, required, forwards);
    }
  }

  for (int i = 0; i < desc->extension_count(); i++) {
    const FieldDescriptor* field = desc->extension(i);
    if (IgnoreField(field)) {
      continue;
    }
    FindRequiresForExtension(options, field, required, forwards);
  }

  for (int i = 0; i < desc->nested_type_count(); i++) {
    FindRequiresForMessage(options, desc->nested_type(i), required, forwards,
                           have_message);
  }
}